

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_remove_page(qpdf_data qpdf,qpdf_oh page)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_8_1_54a39810 local_50;
  function<void_(_qpdf_data_*)> local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle p;
  qpdf_oh page_local;
  qpdf_data qpdf_local;
  
  p.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = page;
  QTC::TC("qpdf","qpdf-c called qpdf_remove_page",0);
  qpdf_oh_item_internal((qpdf_data)local_28,(qpdf_oh)qpdf);
  local_50.p = (QPDFObjectHandle *)local_28;
  std::function<void(_qpdf_data*)>::function<qpdf_remove_page::__0,void>
            ((function<void(_qpdf_data*)> *)&local_48,&local_50);
  QVar1 = trap_errors(qpdf,&local_48);
  std::function<void_(_qpdf_data_*)>::~function(&local_48);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_remove_page(qpdf_data qpdf, qpdf_oh page)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_remove_page");
    auto p = qpdf_oh_item_internal(qpdf, page);
    return trap_errors(qpdf, [&p](qpdf_data q) { q->qpdf->removePage(p); });
}